

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcBalance.c
# Opt level: O0

int Abc_NodeBalanceFindLeft(Vec_Ptr_t *vSuper)

{
  uint uVar1;
  int iVar2;
  Abc_Obj_t *pAVar3;
  Abc_Obj_t *pAVar4;
  int local_2c;
  int Current;
  Abc_Obj_t *pNodeLeft;
  Abc_Obj_t *pNodeRight;
  Vec_Ptr_t *vSuper_local;
  
  iVar2 = Vec_PtrSize(vSuper);
  if (iVar2 < 3) {
    vSuper_local._4_4_ = 0;
  }
  else {
    local_2c = Vec_PtrSize(vSuper);
    pAVar3 = (Abc_Obj_t *)Vec_PtrEntry(vSuper,local_2c + -2);
    for (local_2c = local_2c + -3; -1 < local_2c; local_2c = local_2c + -1) {
      pAVar4 = (Abc_Obj_t *)Vec_PtrEntry(vSuper,local_2c);
      pAVar4 = Abc_ObjRegular(pAVar4);
      uVar1 = *(uint *)&pAVar4->field_0x14;
      pAVar4 = Abc_ObjRegular(pAVar3);
      if (uVar1 >> 0xc != *(uint *)&pAVar4->field_0x14 >> 0xc) break;
    }
    vSuper_local._4_4_ = local_2c + 1;
    pAVar4 = (Abc_Obj_t *)Vec_PtrEntry(vSuper,vSuper_local._4_4_);
    pAVar4 = Abc_ObjRegular(pAVar4);
    uVar1 = *(uint *)&pAVar4->field_0x14;
    pAVar3 = Abc_ObjRegular(pAVar3);
    if (uVar1 >> 0xc != *(uint *)&pAVar3->field_0x14 >> 0xc) {
      __assert_fail("Abc_ObjRegular(pNodeLeft)->Level == Abc_ObjRegular(pNodeRight)->Level",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcBalance.c"
                    ,0xb0,"int Abc_NodeBalanceFindLeft(Vec_Ptr_t *)");
    }
  }
  return vSuper_local._4_4_;
}

Assistant:

int Abc_NodeBalanceFindLeft( Vec_Ptr_t * vSuper )
{
    Abc_Obj_t * pNodeRight, * pNodeLeft;
    int Current;
    // if two or less nodes, pair with the first
    if ( Vec_PtrSize(vSuper) < 3 )
        return 0;
    // set the pointer to the one before the last
    Current = Vec_PtrSize(vSuper) - 2;
    pNodeRight = (Abc_Obj_t *)Vec_PtrEntry( vSuper, Current );
    // go through the nodes to the left of this one
    for ( Current--; Current >= 0; Current-- )
    {
        // get the next node on the left
        pNodeLeft = (Abc_Obj_t *)Vec_PtrEntry( vSuper, Current );
        // if the level of this node is different, quit the loop
        if ( Abc_ObjRegular(pNodeLeft)->Level != Abc_ObjRegular(pNodeRight)->Level )
            break;
    }
    Current++;    
    // get the node, for which the equality holds
    pNodeLeft = (Abc_Obj_t *)Vec_PtrEntry( vSuper, Current );
    assert( Abc_ObjRegular(pNodeLeft)->Level == Abc_ObjRegular(pNodeRight)->Level );
    return Current;
}